

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-quest.c
# Opt level: O0

errr finish_parse_quest(parser *p)

{
  ushort uVar1;
  quest *pqVar2;
  uint uVar3;
  uint local_24;
  wchar_t count;
  quest *next;
  quest *quest;
  parser *p_local;
  
  z_info->quest_max = 0;
  for (next = (quest *)parser_priv(p); next != (quest *)0x0; next = next->next) {
    z_info->quest_max = z_info->quest_max + 1;
  }
  quests = (quest *)mem_zalloc((ulong)z_info->quest_max * 0x30);
  uVar1 = z_info->quest_max;
  next = (quest *)parser_priv(p);
  uVar3 = (uint)uVar1;
  while (local_24 = uVar3 - 1, next != (quest *)0x0) {
    memcpy(quests + (int)local_24,next,0x30);
    quests[(int)local_24].index = (uint8_t)local_24;
    pqVar2 = next->next;
    if ((int)local_24 < (int)(z_info->quest_max - 1)) {
      quests[(int)local_24].next = quests + (int)uVar3;
    }
    else {
      quests[(int)local_24].next = (quest *)0x0;
    }
    mem_free(next);
    next = pqVar2;
    uVar3 = local_24;
  }
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_quest(struct parser *p) {
	struct quest *quest, *next = NULL;
	int count;

	/* Count the entries */
	z_info->quest_max = 0;
	quest = parser_priv(p);
	while (quest) {
		z_info->quest_max++;
		quest = quest->next;
	}

	/* Allocate the direct access list and copy the data to it */
	quests = mem_zalloc(z_info->quest_max * sizeof(*quest));
	count = z_info->quest_max - 1;
	for (quest = parser_priv(p); quest; quest = next, count--) {
		memcpy(&quests[count], quest, sizeof(*quest));
		quests[count].index = count;
		next = quest->next;
		if (count < z_info->quest_max - 1)
			quests[count].next = &quests[count + 1];
		else
			quests[count].next = NULL;

		mem_free(quest);
	}

	parser_destroy(p);
	return 0;
}